

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiling_info-c.cpp
# Opt level: O1

duckdb_value duckdb_profiling_info_get_value(duckdb_profiling_info info,char *key)

{
  _Alloc_hider text;
  MetricsType metric;
  bool bVar1;
  size_t length;
  duckdb_value p_Var2;
  string str;
  allocator local_61;
  string local_60;
  string local_40;
  
  if (info != (duckdb_profiling_info)0x0) {
    std::__cxx11::string::string((string *)&local_40,key,&local_61);
    duckdb::StringUtil::Upper(&local_60,&local_40);
    metric = duckdb::EnumUtil::FromString<duckdb::MetricsType>(local_60._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    bVar1 = duckdb::ProfilingInfo::Enabled((profiler_settings_t *)(info + 8),metric);
    if (bVar1) {
      duckdb::ProfilingInfo::GetMetricAsString_abi_cxx11_
                ((string *)&local_60,(ProfilingInfo *)(info + 8),metric);
      text._M_p = local_60._M_dataplus._M_p;
      length = strlen(local_60._M_dataplus._M_p);
      p_Var2 = duckdb_create_varchar_length(text._M_p,length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p == &local_60.field_2) {
        return p_Var2;
      }
      operator_delete(local_60._M_dataplus._M_p);
      return p_Var2;
    }
  }
  return (duckdb_value)0x0;
}

Assistant:

duckdb_value duckdb_profiling_info_get_value(duckdb_profiling_info info, const char *key) {
	if (!info) {
		return nullptr;
	}
	auto &node = *reinterpret_cast<duckdb::ProfilingNode *>(info);
	auto &profiling_info = node.GetProfilingInfo();
	auto key_enum = EnumUtil::FromString<MetricsType>(duckdb::StringUtil::Upper(key));
	if (!profiling_info.Enabled(profiling_info.settings, key_enum)) {
		return nullptr;
	}

	auto str = profiling_info.GetMetricAsString(key_enum);
	return duckdb_create_varchar_length(str.c_str(), strlen(str.c_str()));
}